

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32 tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  UnknownFieldSet *pUVar5;
  Message *pMVar6;
  undefined4 extraout_var;
  EnumDescriptor *this;
  EnumValueDescriptor *value;
  Reflection *this_00;
  uint64 value_00;
  string *value_01;
  uint64 temp;
  uint32 length;
  string local_d8;
  Limit local_b8;
  uint32 local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if (field == (FieldDescriptor *)0x0) {
LAB_002876aa:
    pUVar5 = Reflection::MutableUnknownFields(this_00,message);
    bVar1 = SkipField(input,tag,pUVar5);
    return bVar1;
  }
  TVar2 = FieldDescriptor::type(field);
  if ((tag & 7) != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)TVar2 * 4)) {
    bVar1 = FieldDescriptor::is_packable(field);
    if ((tag & 7) == 2 && bVar1) {
      bVar1 = io::CodedInputStream::ReadVarint32(input,&local_b4);
      if (!bVar1) {
        return false;
      }
      local_b8 = io::CodedInputStream::PushLimit(input,local_b4);
      TVar2 = FieldDescriptor::type(field);
      switch(TVar2) {
      case TYPE_DOUBLE:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddDouble(this_00,message,field,(double)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_FLOAT:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddFloat(this_00,message,field,local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_INT64:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,(int64)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_UINT64:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddUInt64(this_00,message,field,(uint64)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_INT32:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,(int32)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_FIXED64:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddUInt64(this_00,message,field,(uint64)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_FIXED32:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddUInt32(this_00,message,field,(uint32)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_BOOL:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddBool(this_00,message,field,local_d8._M_dataplus._M_p != (pointer)0x0);
        }
        break;
      case TYPE_STRING:
      case TYPE_GROUP:
      case TYPE_MESSAGE:
      case TYPE_BYTES:
        return false;
      case TYPE_UINT32:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddUInt32(this_00,message,field,(uint32)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_ENUM:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          iVar3 = (int)local_d8._M_dataplus._M_p._0_4_;
          value_00 = (uint64)(int)local_d8._M_dataplus._M_p._0_4_;
          iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          if (*(int *)(*(long *)(CONCAT44(extraout_var,iVar4) + 0x10) + 0x3c) == 3) {
            Reflection::AddEnumValue(this_00,message,field,iVar3);
          }
          else {
            this = FieldDescriptor::enum_type(field);
            value = EnumDescriptor::FindValueByNumber(this,iVar3);
            if (value == (EnumValueDescriptor *)0x0) {
              pUVar5 = Reflection::MutableUnknownFields(this_00,message);
              UnknownFieldSet::AddVarint(pUVar5,tag >> 3,value_00);
            }
            else {
              Reflection::AddEnum(this_00,message,field,value);
            }
          }
        }
        break;
      case TYPE_SFIXED32:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,(int32)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_SFIXED64:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,(int64)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_SINT32:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddInt32
                    (this_00,message,field,
                     -((uint)local_d8._M_dataplus._M_p._0_4_ & 1) ^
                     (uint)local_d8._M_dataplus._M_p._0_4_ >> 1);
        }
        break;
      case MAX_TYPE:
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
          bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_d8);
          if (!bVar1) {
            return false;
          }
          Reflection::AddInt64
                    (this_00,message,field,
                     -(ulong)((uint)local_d8._M_dataplus._M_p & 1) ^
                     (ulong)local_d8._M_dataplus._M_p >> 1);
        }
      }
      io::CodedInputStream::PopLimit(input,local_b8);
      return true;
    }
    goto LAB_002876aa;
  }
  TVar2 = FieldDescriptor::type(field);
  switch(TVar2) {
  case TYPE_DOUBLE:
    bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_d8);
    if (!bVar1) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(this_00,message,field,(double)local_d8._M_dataplus._M_p);
    }
    else {
      Reflection::SetDouble(this_00,message,field,(double)local_d8._M_dataplus._M_p);
    }
    break;
  case TYPE_FLOAT:
    bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_d8);
    if (!bVar1) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddFloat(this_00,message,field,local_d8._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetFloat(this_00,message,field,local_d8._M_dataplus._M_p._0_4_);
    }
    break;
  case TYPE_INT64:
    bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_d8);
    goto LAB_002877d5;
  case TYPE_UINT64:
    bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_d8);
    goto LAB_002878b5;
  case TYPE_INT32:
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_d8);
    goto LAB_00287763;
  case TYPE_FIXED64:
    bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_d8);
LAB_002878b5:
    if (bVar1 == false) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(this_00,message,field,(uint64)local_d8._M_dataplus._M_p);
      return true;
    }
    Reflection::SetUInt64(this_00,message,field,(uint64)local_d8._M_dataplus._M_p);
    return true;
  case TYPE_FIXED32:
    bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_d8);
    goto LAB_0028791c;
  case TYPE_BOOL:
    bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_d8);
    if (!bVar1) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(this_00,message,field,local_d8._M_dataplus._M_p != (pointer)0x0);
    }
    else {
      Reflection::SetBool(this_00,message,field,local_d8._M_dataplus._M_p != (pointer)0x0);
    }
    break;
  case TYPE_STRING:
    iVar3 = *(int *)(*(long *)(field + 0x28) + 0x3c);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    bVar1 = WireFormatLite::ReadBytes(input,&local_d8);
    if (!bVar1) {
LAB_002879df:
      std::__cxx11::string::~string((string *)&local_d8);
      return false;
    }
    if (iVar3 == 3) {
      bVar1 = WireFormatLite::VerifyUtf8String
                        (local_d8._M_dataplus._M_p,(int)local_d8._M_string_length,PARSE,
                         (char *)**(undefined8 **)(field + 8));
      if (!bVar1) goto LAB_002879df;
    }
    if (*(int *)(field + 0x3c) == 3) {
      value_01 = &local_50;
      std::__cxx11::string::string((string *)value_01,(string *)&local_d8);
      Reflection::AddString(this_00,message,field,value_01);
    }
    else {
      value_01 = &local_70;
      std::__cxx11::string::string((string *)value_01,(string *)&local_d8);
      Reflection::SetString(this_00,message,field,value_01);
    }
    goto LAB_00287e5a;
  case TYPE_GROUP:
    if (*(int *)(field + 0x3c) == 3) {
      pMVar6 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar6 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar1 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar6);
    goto LAB_00287a4c;
  case TYPE_MESSAGE:
    if (*(int *)(field + 0x3c) == 3) {
      pMVar6 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar6 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar1 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar6);
LAB_00287a4c:
    if (bVar1 == false) {
      return false;
    }
    return true;
  case TYPE_BYTES:
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    bVar1 = WireFormatLite::ReadBytes(input,&local_d8);
    if (!bVar1) goto LAB_002879df;
    if (*(int *)(field + 0x3c) == 3) {
      value_01 = &local_90;
      std::__cxx11::string::string((string *)value_01,(string *)&local_d8);
      Reflection::AddString(this_00,message,field,value_01);
    }
    else {
      value_01 = &local_b0;
      std::__cxx11::string::string((string *)value_01,(string *)&local_d8);
      Reflection::SetString(this_00,message,field,value_01);
    }
LAB_00287e5a:
    std::__cxx11::string::~string((string *)value_01);
    std::__cxx11::string::~string((string *)&local_d8);
    break;
  case TYPE_UINT32:
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_d8);
LAB_0028791c:
    if (bVar1 == false) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(this_00,message,field,(uint32)local_d8._M_dataplus._M_p._0_4_);
      return true;
    }
    Reflection::SetUInt32(this_00,message,field,(uint32)local_d8._M_dataplus._M_p._0_4_);
    return true;
  case TYPE_ENUM:
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_d8);
    if (!bVar1) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddEnumValue(this_00,message,field,(int)local_d8._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetEnumValue(this_00,message,field,(int)local_d8._M_dataplus._M_p._0_4_);
    }
    break;
  case TYPE_SFIXED32:
    bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_d8);
LAB_00287763:
    if (bVar1 == false) {
      return false;
    }
LAB_0028776e:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt32(this_00,message,field,(int32)local_d8._M_dataplus._M_p._0_4_);
      return true;
    }
    Reflection::SetInt32(this_00,message,field,(int32)local_d8._M_dataplus._M_p._0_4_);
    return true;
  case TYPE_SFIXED64:
    bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_d8);
LAB_002877d5:
    if (bVar1 == false) {
      return false;
    }
LAB_0028788d:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(this_00,message,field,(int64)local_d8._M_dataplus._M_p);
    }
    else {
      Reflection::SetInt64(this_00,message,field,(int64)local_d8._M_dataplus._M_p);
    }
    break;
  case TYPE_SINT32:
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_d8);
    if (!bVar1) {
      return false;
    }
    local_d8._M_dataplus._M_p._0_4_ =
         (float)(-((uint)local_d8._M_dataplus._M_p._0_4_ & 1) ^
                (uint)local_d8._M_dataplus._M_p._0_4_ >> 1);
    goto LAB_0028776e;
  case MAX_TYPE:
    bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_d8);
    if (!bVar1) {
      return false;
    }
    local_d8._M_dataplus._M_p =
         (pointer)(-(ulong)((uint)local_d8._M_dataplus._M_p & 1) ^
                  (ulong)local_d8._M_dataplus._M_p >> 1);
    goto LAB_0028788d;
  }
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32 tag,
    const FieldDescriptor* field,  // May be NULL for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == NULL) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32 length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32, Int32)
      HANDLE_PACKED_TYPE(INT64, int64, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != NULL) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64 sign_extended_value = static_cast<int64>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32, Int32)
      HANDLE_TYPE(INT64, int64, Int64)
      HANDLE_TYPE(SINT32, int32, Int32)
      HANDLE_TYPE(SINT64, int64, Int64)
      HANDLE_TYPE(UINT32, uint32, UInt32)
      HANDLE_TYPE(UINT64, uint64, UInt64)

      HANDLE_TYPE(FIXED32, uint32, UInt32)
      HANDLE_TYPE(FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32, int32, Int32)
      HANDLE_TYPE(SFIXED64, int64, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}